

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3ca8ed::Nrom_prg_rom_should_not_be_writable_Test::
~Nrom_prg_rom_should_not_be_writable_Test(Nrom_prg_rom_should_not_be_writable_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Nrom, prg_rom_should_not_be_writable) {
    constexpr int kPrgRomBanks = 2;
    std::string bytes{nrom_bytes(kPrgRomBanks, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> nrom = RomFactory::from_bytes(ss);

    nrom->cpu_write_byte(0x8000, 0x11);
    EXPECT_EQ(0x00, nrom->cpu_read_byte(0x8000));
    nrom->cpu_write_byte(0xFFFF, 0x12);
    EXPECT_EQ(0x00, nrom->cpu_read_byte(0xFFFF));
}